

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O3

void __thiscall net_uv::KCPServer::clearData(KCPServer *this)

{
  Mutex *mutex;
  _Elt_pointer pNVar1;
  _Elt_pointer pSVar2;
  
  mutex = &(this->super_Server).super_Runnable.m_msgMutex;
  uv_mutex_lock(&mutex->m_uv_mutext);
  pNVar1 = ((iterator *)
           ((long)&(this->super_Server).super_Runnable.m_msgQue.c.
                   super__Deque_base<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>.
                   _M_impl.super__Deque_impl_data + 0x10))->_M_cur;
  if (((iterator *)
      ((long)&(this->super_Server).super_Runnable.m_msgQue.c.
              super__Deque_base<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>._M_impl
              .super__Deque_impl_data + 0x30))->_M_cur != pNVar1) {
    do {
      if (pNVar1->data != (char *)0x0) {
        free(pNVar1->data);
      }
      std::deque<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>::pop_front
                (&(this->super_Server).super_Runnable.m_msgQue.c);
      pNVar1 = ((iterator *)
               ((long)&(this->super_Server).super_Runnable.m_msgQue.c.
                       super__Deque_base<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>
                       ._M_impl.super__Deque_impl_data + 0x10))->_M_cur;
    } while (((iterator *)
             ((long)&(this->super_Server).super_Runnable.m_msgQue.c.
                     super__Deque_base<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>.
                     _M_impl.super__Deque_impl_data + 0x30))->_M_cur != pNVar1);
  }
  uv_mutex_unlock(&mutex->m_uv_mutext);
  pSVar2 = ((iterator *)
           ((long)&(this->super_Server).super_SessionManager.m_operationQue.c.
                   super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                   ._M_impl.super__Deque_impl_data + 0x10))->_M_cur;
  if (((iterator *)
      ((long)&(this->super_Server).super_SessionManager.m_operationQue.c.
              super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
              ._M_impl.super__Deque_impl_data + 0x30))->_M_cur != pSVar2) {
    do {
      if (pSVar2->operationType == 1) {
        free(pSVar2->operationData);
      }
      std::
      deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
      ::pop_front(&(this->super_Server).super_SessionManager.m_operationQue.c);
      pSVar2 = ((iterator *)
               ((long)&(this->super_Server).super_SessionManager.m_operationQue.c.
                       super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                       ._M_impl.super__Deque_impl_data + 0x10))->_M_cur;
    } while (((iterator *)
             ((long)&(this->super_Server).super_SessionManager.m_operationQue.c.
                     super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                     ._M_impl.super__Deque_impl_data + 0x30))->_M_cur != pSVar2);
  }
  return;
}

Assistant:

void KCPServer::clearData()
{
	m_msgMutex.lock();
	while (!m_msgQue.empty())
	{
		if (m_msgQue.front().data)
		{
			fc_free(m_msgQue.front().data);
		}
		m_msgQue.pop();
	}
	m_msgMutex.unlock();
	while (!m_operationQue.empty())
	{
		if (m_operationQue.front().operationType == KCP_SVR_OP_SEND_DATA)
		{
			fc_free(m_operationQue.front().operationData);
		}
		m_operationQue.pop();
	}
}